

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
* __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
::ParseStream<1u,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
          (GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
           *this,GenericInsituStringStream<rapidjson::UTF8<char>_> *is)

{
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  *pGVar1;
  long lVar2;
  undefined8 uVar3;
  ParseResult PVar4;
  ClearStackOnExit scope;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> reader;
  ClearStackOnExit local_58;
  undefined8 local_50;
  void *local_48;
  void *pvStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined8 local_18;
  
  local_50 = *(undefined8 *)(this + 0x20);
  local_48 = (void *)0x0;
  pvStack_40 = (void *)0x0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0x100;
  local_20 = 0;
  local_18 = 0;
  local_58.d_ = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 *)this;
  PVar4 = GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
          Parse<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    ((GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>
                      *)&local_50,is,
                     (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)this);
  *(ParseErrorCode *)(this + 0x50) = PVar4.code_;
  *(size_t *)(this + 0x58) = PVar4.offset_;
  if (PVar4.code_ == kParseErrorNone) {
    lVar2 = *(long *)(this + 0x38);
    if (lVar2 - *(long *)(this + 0x30) != 0x10) {
      __assert_fail("stack_.GetSize() == sizeof(ValueType)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/document.h"
                    ,0x8b4,
                    "GenericDocument<Encoding, Allocator, StackAllocator> &rapidjson::GenericDocument<rapidjson::UTF8<>>::ParseStream(InputStream &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, SourceEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>]"
                   );
    }
    pGVar1 = (GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)(lVar2 + -0x10);
    *(GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
      **)(this + 0x38) = pGVar1;
    if (pGVar1 == this) {
      __assert_fail("this != &rhs",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/document.h"
                    ,0x32a,
                    "GenericValue<Encoding, Allocator> &rapidjson::GenericValue<rapidjson::UTF8<>>::operator=(GenericValue<Encoding, Allocator> &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    uVar3 = *(undefined8 *)(lVar2 + -8);
    *(undefined8 *)this = *(undefined8 *)pGVar1;
    *(undefined8 *)(this + 8) = uVar3;
    *(undefined2 *)(lVar2 + -2) = 0;
  }
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::ClearStackOnExit::~ClearStackOnExit(&local_58);
  free(pvStack_40);
  operator_delete(local_48,1);
  return (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *)this;
}

Assistant:

GenericDocument& ParseStream(InputStream& is) {
        GenericReader<SourceEncoding, Encoding, StackAllocator> reader(
            stack_.HasAllocator() ? &stack_.GetAllocator() : 0);
        ClearStackOnExit scope(*this);
        parseResult_ = reader.template Parse<parseFlags>(is, *this);
        if (parseResult_) {
            RAPIDJSON_ASSERT(stack_.GetSize() == sizeof(ValueType)); // Got one and only one root object
            ValueType::operator=(*stack_.template Pop<ValueType>(1));// Move value from stack to document
        }
        return *this;
    }